

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O2

int key_schedule(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,ptls_aead_context_t **ctx,
                int is_enc,void *shared_secret,ptls_iovec_t info)

{
  size_t delta;
  ptls_iovec_t info_00;
  ptls_iovec_t info_01;
  int iVar1;
  ptls_aead_context_t *ppVar2;
  ptls_iovec_t salt;
  ptls_iovec_t prk;
  ptls_iovec_t prk_00;
  undefined1 local_199;
  ptls_buffer_t key_schedule_context;
  uint8_t base_nonce [32];
  uint8_t key [32];
  uint8_t secret [64];
  uint8_t key_schedule_context_smallbuf [128];
  
  *ctx = (ptls_aead_context_t *)0x0;
  key_schedule_context.base = key_schedule_context_smallbuf;
  key_schedule_context.off = 0;
  key_schedule_context.capacity = 0x80;
  key_schedule_context.is_allocated = '\0';
  key_schedule_context.align_bits = '\0';
  local_199 = 0;
  iVar1 = ptls_buffer__do_pushv(&key_schedule_context,&local_199,1);
  if (((iVar1 == 0) &&
      (iVar1 = ptls_buffer_reserve(&key_schedule_context,cipher->hash->digest_size), iVar1 == 0)) &&
     (iVar1 = labeled_extract(kem,cipher,key_schedule_context.base + key_schedule_context.off,
                              (ptls_iovec_t)ZEXT816(0),"psk_id_hash",(ptls_iovec_t)ZEXT816(0)),
     iVar1 == 0)) {
    delta = cipher->hash->digest_size;
    key_schedule_context.off = key_schedule_context.off + delta;
    iVar1 = ptls_buffer_reserve(&key_schedule_context,delta);
    if ((iVar1 == 0) &&
       (iVar1 = labeled_extract(kem,cipher,key_schedule_context.base + key_schedule_context.off,
                                (ptls_iovec_t)ZEXT816(0),"info_hash",info), iVar1 == 0)) {
      key_schedule_context.off = key_schedule_context.off + cipher->hash->digest_size;
      salt.len = kem->hash->digest_size;
      salt.base = (uint8_t *)shared_secret;
      iVar1 = labeled_extract(kem,cipher,secret,salt,"secret",(ptls_iovec_t)ZEXT816(0x11f371));
      if ((iVar1 == 0) &&
         ((info_00.len = key_schedule_context.off, info_00.base = key_schedule_context.base,
          prk.len = cipher->hash->digest_size, prk.base = secret,
          iVar1 = labeled_expand(kem,cipher,key,cipher->aead->key_size,prk,"key",info_00),
          iVar1 == 0 &&
          (info_01.len = key_schedule_context.off, info_01.base = key_schedule_context.base,
          prk_00.len = cipher->hash->digest_size, prk_00.base = secret,
          iVar1 = labeled_expand(kem,cipher,base_nonce,cipher->aead->iv_size,prk_00,"base_nonce",
                                 info_01), iVar1 == 0)))) {
        ppVar2 = ptls_aead_new_direct(cipher->aead,is_enc,key,base_nonce);
        *ctx = ppVar2;
        iVar1 = 0;
      }
    }
  }
  ptls_buffer_dispose(&key_schedule_context);
  (*ptls_clear_memory)(secret,0x40);
  (*ptls_clear_memory)(key,0x20);
  (*ptls_clear_memory)(base_nonce,0x20);
  return iVar1;
}

Assistant:

static int key_schedule(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, ptls_aead_context_t **ctx, int is_enc,
                        const void *shared_secret, ptls_iovec_t info)
{
    ptls_buffer_t key_schedule_context;
    uint8_t key_schedule_context_smallbuf[128], secret[PTLS_MAX_DIGEST_SIZE], key[PTLS_MAX_SECRET_SIZE],
        base_nonce[PTLS_MAX_IV_SIZE];
    int ret;

    *ctx = NULL;

    ptls_buffer_init(&key_schedule_context, key_schedule_context_smallbuf, sizeof(key_schedule_context_smallbuf));

    /* key_schedule_context = concat(mode, LabeledExtract("", "psk_id_hash", psk_id), LabeledExtract("", "info_hash", info)) */
    ptls_buffer_push(&key_schedule_context, PTLS_HPKE_MODE_BASE);
    if ((ret = ptls_buffer_reserve(&key_schedule_context, cipher->hash->digest_size)) != 0 ||
        (ret = labeled_extract(kem, cipher, key_schedule_context.base + key_schedule_context.off, ptls_iovec_init(NULL, 0),
                               "psk_id_hash", ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    key_schedule_context.off += cipher->hash->digest_size;
    if ((ret = ptls_buffer_reserve(&key_schedule_context, cipher->hash->digest_size)) != 0 ||
        (ret = labeled_extract(kem, cipher, key_schedule_context.base + key_schedule_context.off, ptls_iovec_init(NULL, 0),
                               "info_hash", info)) != 0)
        goto Exit;
    key_schedule_context.off += cipher->hash->digest_size;

    /* secret = LabeledExtract(shared_secret, "secret", psk) */
    if ((ret = labeled_extract(kem, cipher, secret, ptls_iovec_init(shared_secret, kem->hash->digest_size), "secret",
                               ptls_iovec_init("", 0))) != 0)
        goto Exit;

    /* key, base_nonce */
    if ((ret = labeled_expand(kem, cipher, key, cipher->aead->key_size, ptls_iovec_init(secret, cipher->hash->digest_size), "key",
                              ptls_iovec_init(key_schedule_context.base, key_schedule_context.off))) != 0)
        goto Exit;
    if ((ret = labeled_expand(kem, cipher, base_nonce, cipher->aead->iv_size, ptls_iovec_init(secret, cipher->hash->digest_size),
                              "base_nonce", ptls_iovec_init(key_schedule_context.base, key_schedule_context.off))) != 0)
        goto Exit;

    *ctx = ptls_aead_new_direct(cipher->aead, is_enc, key, base_nonce);

Exit:
    ptls_buffer_dispose(&key_schedule_context);
    ptls_clear_memory(secret, sizeof(secret));
    ptls_clear_memory(key, sizeof(key));
    ptls_clear_memory(base_nonce, sizeof(base_nonce));
    return ret;
}